

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::NonMaximumSuppression::Clear(NonMaximumSuppression *this)

{
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->confidenceinputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->coordinatesinputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->iouthresholdinputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
            (&this->confidencethresholdinputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->confidenceoutputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->coordinatesoutputfeaturename_);
  this->iouthreshold_ = 0.0;
  this->confidencethreshold_ = 0.0;
  clear_SuppressionMethod(this);
  clear_ClassLabels(this);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void NonMaximumSuppression::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NonMaximumSuppression)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  confidenceinputfeaturename_.ClearToEmpty();
  coordinatesinputfeaturename_.ClearToEmpty();
  iouthresholdinputfeaturename_.ClearToEmpty();
  confidencethresholdinputfeaturename_.ClearToEmpty();
  confidenceoutputfeaturename_.ClearToEmpty();
  coordinatesoutputfeaturename_.ClearToEmpty();
  ::memset(&iouthreshold_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&confidencethreshold_) -
      reinterpret_cast<char*>(&iouthreshold_)) + sizeof(confidencethreshold_));
  clear_SuppressionMethod();
  clear_ClassLabels();
  _internal_metadata_.Clear<std::string>();
}